

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O2

int cpuCount(void)

{
  char cVar1;
  int iVar2;
  
  cVar1 = IlmThread_2_5::supportsThreads();
  if (cVar1 != '\0') {
    iVar2 = std::thread::hardware_concurrency();
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    return iVar2;
  }
  return 1;
}

Assistant:

int
cpuCount()
{
    if (!ILMTHREAD_NAMESPACE::supportsThreads()) return 1;

    int cpuCount = 1;

#if __cplusplus >= 201103L
    cpuCount = std::thread::hardware_concurrency();
#else

#if defined (OPENEXR_IMF_HAVE_SYSCONF_NPROCESSORS_ONLN)

    cpuCount = sysconf(_SC_NPROCESSORS_ONLN);

#elif defined (_WIN32)

    SYSTEM_INFO sysinfo;
    GetSystemInfo( &sysinfo );
    cpuCount = sysinfo.dwNumberOfProcessors;

#endif

#endif
    if (cpuCount < 1) cpuCount = 1;
    return cpuCount;
}